

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cabal.c
# Opt level: O0

void spell_piety(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RDX;
  char buf [4608];
  AFFECT_DATA af;
  CHAR_DATA *in_stack_ffffffffffffed78;
  CHAR_DATA *in_stack_ffffffffffffed80;
  CHAR_DATA *in_stack_ffffffffffffed88;
  char *in_stack_ffffffffffffed90;
  
  bVar1 = is_npc(in_stack_ffffffffffffed78);
  if (!bVar1) {
    bVar1 = is_affected(in_RDX,(int)gsn_piety);
    if (bVar1) {
      send_to_char(in_stack_ffffffffffffed90,in_stack_ffffffffffffed88);
    }
    else {
      init_affect((AFFECT_DATA *)0x653a68);
      affect_to_char(in_stack_ffffffffffffed80,(AFFECT_DATA *)in_stack_ffffffffffffed78);
      act(in_stack_ffffffffffffed90,in_stack_ffffffffffffed88,in_stack_ffffffffffffed80,
          in_stack_ffffffffffffed78,0);
      act(in_stack_ffffffffffffed90,in_stack_ffffffffffffed88,in_stack_ffffffffffffed80,
          in_stack_ffffffffffffed78,0);
    }
  }
  return;
}

Assistant:

void spell_piety(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	char buf[MSL];

	if (is_npc(ch))
		return;

	if (is_affected(ch, gsn_piety))
	{
		send_to_char("Your righteous wrath already infuses you with vigor.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_piety;
	af.level = level;
	af.aftype = AFT_POWER;
	af.location = APPLY_AC;
	af.modifier = level / 4;
	af.duration = level / 5;
	affect_to_char(ch, &af);

	act("Your righteous wrath at the impure surges through you.", ch, 0, 0, TO_CHAR);
	act("$n stands taller as $s righteous wrath infuses $m.", ch, 0, 0, TO_ROOM);
}